

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O2

void __thiscall
libtorrent::anon_unknown_5::ut_metadata_peer_plugin::tick(ut_metadata_peer_plugin *this)

{
  int piece;
  const_iterator __position;
  
  maybe_send_request(this);
  while ((__position._M_current =
               (this->m_incoming_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
         __position._M_current !=
         (this->m_incoming_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish &&
         ((this->m_pc->super_peer_connection).m_send_buffer.m_bytes < 0x28000))) {
    piece = *__position._M_current;
    ::std::vector<int,_std::allocator<int>_>::erase(&this->m_incoming_requests,__position);
    write_metadata_packet(this,piece,piece);
  }
  return;
}

Assistant:

void tick() override
		{
			maybe_send_request();
			while (!m_incoming_requests.empty()
				&& m_pc.send_buffer_size() < send_buffer_limit)
			{
				int const piece = m_incoming_requests.front();
				m_incoming_requests.erase(m_incoming_requests.begin());
				write_metadata_packet(msg_t::piece, piece);
			}
		}